

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O1

void __thiscall CTcCodeStream::release_labels(CTcCodeStream *this)

{
  CTcLabelFixup *pCVar1;
  CTcCodeLabel *lbl;
  CTcCodeLabel *pCVar2;
  CTcLabelFixup *fixup;
  int iVar3;
  
  iVar3 = 0;
  pCVar2 = this->active_lbl_;
  while (pCVar2 != (CTcCodeLabel *)0x0) {
    this->active_lbl_ = pCVar2->nxt;
    pCVar2->nxt = this->free_lbl_;
    this->free_lbl_ = pCVar2;
    while (pCVar1 = pCVar2->fhead, pCVar1 != (CTcLabelFixup *)0x0) {
      pCVar2->fhead = pCVar1->nxt;
      pCVar1->nxt = this->free_fixup_;
      this->free_fixup_ = pCVar1;
      iVar3 = iVar3 + 1;
    }
    pCVar2 = this->active_lbl_;
  }
  if (iVar3 != 0) {
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_INTERNAL,0x2ced);
    return;
  }
  return;
}

Assistant:

void CTcCodeStream::release_labels()
{
    int err_cnt;

    /* we haven't found any errors yet */
    err_cnt = 0;
    
    /* run through the list of active labels */
    while (active_lbl_ != 0)
    {
        CTcCodeLabel *lbl;

        /* pull this label off of the active list */
        lbl = active_lbl_;
        active_lbl_ = active_lbl_->nxt;

        /* put this label on the free list */
        lbl->nxt = free_lbl_;
        free_lbl_ = lbl;

        /* check for unresolved fixups */
        while (lbl->fhead != 0)
        {
            CTcLabelFixup *fixup;
            
            /* pull this fixup off of the active list */
            fixup = lbl->fhead;
            lbl->fhead = lbl->fhead->nxt;

            /* put this fixup on the free list */
            fixup->nxt = free_fixup_;
            free_fixup_ = fixup;
            
            /* count the unresolved label */
            ++err_cnt;
        }
    }

    /* 
     *   if we found any unresolved fixups, log the error; there's not
     *   much point in logging each error individually, since this is an
     *   internal compiler error that the user can't do anything about,
     *   but at least give the user a count for compiler diagnostic
     *   purposes 
     */
    if (err_cnt != 0)
        G_tcmain->log_error(0, 0, TC_SEV_INTERNAL,
                          TCERR_UNRES_TMP_FIXUP, err_cnt);
}